

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitArrayNew(InfoCollector *this,ArrayNew *curr)

{
  CollectedFuncInfo *pCVar1;
  bool bVar2;
  PossibleContents local_110;
  DataLocation local_f0;
  Type local_e0 [2];
  uintptr_t local_d0;
  undefined1 local_c8 [64];
  DataLocation local_88;
  ExpressionLocation local_78;
  undefined1 local_68 [64];
  uintptr_t local_28;
  HeapType type;
  ArrayNew *curr_local;
  InfoCollector *this_local;
  
  type.id._4_4_ = 1;
  bVar2 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.
                      type,(BasicType *)((long)&type.id + 4));
  if (!bVar2) {
    local_28 = (uintptr_t)
               wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).
                           super_Expression.type);
    if (curr->init == (Expression *)0x0) {
      pCVar1 = this->info;
      HeapType::getArray((HeapType *)local_e0);
      local_d0 = local_e0[0].id;
      getNullLocation((Location *)local_c8,this,local_e0[0]);
      local_f0.type.id = local_28;
      local_f0.index = 0;
      std::
      variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
      ::variant<wasm::DataLocation,void,void,wasm::DataLocation,void>
                ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
                  *)(local_c8 + 0x20),&local_f0);
      std::
      vector<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>_>_>
      ::push_back(&pCVar1->links,(value_type *)local_c8);
    }
    else {
      pCVar1 = this->info;
      local_78.expr = curr->init;
      local_78.tupleIndex = 0;
      std::
      variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
      ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>
                ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
                  *)local_68,&local_78);
      local_88.type.id = local_28;
      local_88.index = 0;
      std::
      variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
      ::variant<wasm::DataLocation,void,void,wasm::DataLocation,void>
                ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
                  *)(local_68 + 0x20),&local_88);
      std::
      vector<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>_>_>
      ::push_back(&pCVar1->links,(value_type *)local_68);
    }
    PossibleContents::exactType
              (&local_110,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.
                     type.id);
    addRoot(this,(Expression *)curr,&local_110);
    PossibleContents::~PossibleContents(&local_110);
  }
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    auto type = curr->type.getHeapType();
    if (curr->init) {
      info.links.push_back(
        {ExpressionLocation{curr->init, 0}, DataLocation{type, 0}});
    } else {
      info.links.push_back(
        {getNullLocation(type.getArray().element.type), DataLocation{type, 0}});
    }
    addRoot(curr, PossibleContents::exactType(curr->type));
  }